

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

bstring bjoin(bstrList *bl,bstring sep)

{
  int iVar1;
  bstring ptVar2;
  int local_30;
  int v;
  int c;
  int i;
  bstring b;
  bstring sep_local;
  bstrList *bl_local;
  
  if ((bl == (bstrList *)0x0) || (bl->qty < 0)) {
    bl_local = (bstrList *)0x0;
  }
  else if ((sep == (bstring)0x0) || ((-1 < sep->slen && (sep->data != (uchar *)0x0)))) {
    local_30 = 1;
    for (v = 0; v < bl->qty; v = v + 1) {
      iVar1 = bl->entry[v]->slen;
      if (iVar1 < 0) {
        return (bstring)0x0;
      }
      local_30 = iVar1 + local_30;
      if (local_30 < 0) {
        return (bstring)0x0;
      }
    }
    if (sep != (bstring)0x0) {
      local_30 = (bl->qty + -1) * sep->slen + local_30;
    }
    bl_local = (bstrList *)malloc(0x10);
    if (bl_local == (bstrList *)0x0) {
      bl_local = (bstrList *)0x0;
    }
    else {
      ptVar2 = (bstring)malloc((long)local_30);
      bl_local->entry[0] = ptVar2;
      if (bl_local->entry[0] == (bstring)0x0) {
        free(bl_local);
        bl_local = (bstrList *)0x0;
      }
      else {
        bl_local->qty = local_30;
        *(int *)&bl_local->field_0x4 = local_30 + -1;
        local_30 = 0;
        for (v = 0; v < bl->qty; v = v + 1) {
          if ((0 < v) && (sep != (bstring)0x0)) {
            memcpy((void *)((long)&bl_local->entry[0]->mlen + (long)local_30),sep->data,
                   (long)sep->slen);
            local_30 = sep->slen + local_30;
          }
          iVar1 = bl->entry[v]->slen;
          memcpy((void *)((long)&bl_local->entry[0]->mlen + (long)local_30),bl->entry[v]->data,
                 (long)iVar1);
          local_30 = iVar1 + local_30;
        }
        *(undefined1 *)((long)&bl_local->entry[0]->mlen + (long)local_30) = 0;
      }
    }
  }
  else {
    bl_local = (bstrList *)0x0;
  }
  return (bstring)bl_local;
}

Assistant:

bstring bjoin (const struct bstrList * bl, const bstring sep) {
bstring b;
int i, c, v;

	if (bl == NULL || bl->qty < 0) return NULL;
	if (sep != NULL && (sep->slen < 0 || sep->data == NULL)) return NULL;

	for (i = 0, c = 1; i < bl->qty; i++) {
		v = bl->entry[i]->slen;
		if (v < 0) return NULL;	/* Invalid input */
		c += v;
		if (c < 0) return NULL;	/* Wrap around ?? */
	}

	if (sep != NULL) c += (bl->qty - 1) * sep->slen;

	b = (bstring) bstr__alloc (sizeof (struct tagbstring));
	if (b == NULL) return NULL; /* Out of memory */
	b->data = (unsigned char *) bstr__alloc (c);
	if (b->data == NULL) {
		bstr__free (b);
		return NULL;
	}

	b->mlen = c;
	b->slen = c-1;

	for (i = 0, c = 0; i < bl->qty; i++) {
		if (i > 0 && sep != NULL) {
			bstr__memcpy (b->data + c, sep->data, sep->slen);
			c += sep->slen;
		}
		v = bl->entry[i]->slen;
		bstr__memcpy (b->data + c, bl->entry[i]->data, v);
		c += v;
	}
	b->data[c] = (unsigned char) '\0';
	return b;
}